

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack28_32(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 0xfffffff;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 0x1c;
  *puVar1 = (in[1] & 0xffffff) << 4 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[1] >> 0x18;
  *puVar1 = (in[2] & 0xfffff) << 8 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = in[2] >> 0x14;
  *puVar1 = (in[3] & 0xffff) << 0xc | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = in[3] >> 0x10;
  *puVar1 = (in[4] & 0xfff) << 0x10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = in[4] >> 0xc;
  *puVar1 = (in[5] & 0xff) << 0x14 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = in[5] >> 8;
  *puVar1 = (in[6] & 0xf) << 0x18 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = in[6] >> 4;
  *puVar1 = base + *puVar1;
  puVar1 = out + 8;
  *puVar1 = in[7] & 0xfffffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 9;
  *puVar1 = in[7] >> 0x1c;
  *puVar1 = (in[8] & 0xffffff) << 4 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 10;
  *puVar1 = in[8] >> 0x18;
  *puVar1 = (in[9] & 0xfffff) << 8 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = in[9] >> 0x14;
  *puVar1 = (in[10] & 0xffff) << 0xc | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = in[10] >> 0x10;
  *puVar1 = (in[0xb] & 0xfff) << 0x10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = in[0xb] >> 0xc;
  *puVar1 = (in[0xc] & 0xff) << 0x14 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = in[0xc] >> 8;
  *puVar1 = (in[0xd] & 0xf) << 0x18 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = in[0xd] >> 4;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x10;
  *puVar1 = in[0xe] & 0xfffffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x11;
  *puVar1 = in[0xe] >> 0x1c;
  *puVar1 = (in[0xf] & 0xffffff) << 4 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x12;
  *puVar1 = in[0xf] >> 0x18;
  *puVar1 = (in[0x10] & 0xfffff) << 8 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x13;
  *puVar1 = in[0x10] >> 0x14;
  *puVar1 = (in[0x11] & 0xffff) << 0xc | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x14;
  *puVar1 = in[0x11] >> 0x10;
  *puVar1 = (in[0x12] & 0xfff) << 0x10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x15;
  *puVar1 = in[0x12] >> 0xc;
  *puVar1 = (in[0x13] & 0xff) << 0x14 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x16;
  *puVar1 = in[0x13] >> 8;
  *puVar1 = (in[0x14] & 0xf) << 0x18 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x17;
  *puVar1 = in[0x14] >> 4;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x18;
  *puVar1 = in[0x15] & 0xfffffff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x19;
  *puVar1 = in[0x15] >> 0x1c;
  *puVar1 = (in[0x16] & 0xffffff) << 4 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1a;
  *puVar1 = in[0x16] >> 0x18;
  *puVar1 = (in[0x17] & 0xfffff) << 8 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1b;
  *puVar1 = in[0x17] >> 0x14;
  *puVar1 = (in[0x18] & 0xffff) << 0xc | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1c;
  *puVar1 = in[0x18] >> 0x10;
  *puVar1 = (in[0x19] & 0xfff) << 0x10 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1d;
  *puVar1 = in[0x19] >> 0xc;
  *puVar1 = (in[0x1a] & 0xff) << 0x14 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1e;
  *puVar1 = in[0x1a] >> 8;
  *puVar1 = (in[0x1b] & 0xf) << 0x18 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0x1f;
  *puVar1 = in[0x1b] >> 4;
  *puVar1 = base + *puVar1;
  return in + 0x1c;
}

Assistant:

uint32_t * unpack28_32( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 28 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 28 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 28 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 28 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 28 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 28 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 28 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 28 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 28 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 28 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 28 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 28 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 28 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 28 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 28 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 28 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 28 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 28 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 28 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 28 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 28 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 28 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 28 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 28 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 28 - 16 );
    *out += base;
    out++;
    *out = ( (*in) >>  16  ) ;
    ++in;
    *out |= ((*in) % (1U<< 12 ))<<( 28 - 12 );
    *out += base;
    out++;
    *out = ( (*in) >>  12  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 28 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 28 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}